

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

bool __thiscall Diligent::ShaderResourceCacheGL::CachedSSBO::IsDynamic(CachedSSBO *this)

{
  BufferViewGLImpl *pBVar1;
  IBuffer *pSrcPtr;
  
  pBVar1 = (this->pBufferView).m_pObject;
  if (pBVar1 != (BufferViewGLImpl *)0x0) {
    pSrcPtr = (pBVar1->super_BufferViewBase<Diligent::EngineGLImplTraits>).m_pBuffer;
    if (pSrcPtr != (IBuffer *)0x0) {
      CheckDynamicType<Diligent::BufferGLImpl_const,Diligent::IBuffer>(pSrcPtr);
    }
    return (_func_int **)
           (((this->pBufferView).m_pObject)->super_BufferViewBase<Diligent::EngineGLImplTraits>).
           super_DeviceObjectBase<Diligent::IBufferViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferViewDesc>
           .m_Desc.ByteWidth < pSrcPtr[4].super_IDeviceObject.super_IObject._vptr_IObject;
  }
  return false;
}

Assistant:

explicit operator bool() const noexcept { return m_pObject != nullptr; }